

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O0

Lexeme * __thiscall CFGsContainer::nextToken(Lexeme *__return_storage_ptr__,CFGsContainer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long_long uVar5;
  string local_58 [52];
  int local_24;
  int local_20;
  int c;
  int state;
  CFGsContainer *this_local;
  Lexeme *lex;
  
  c._3_1_ = 0;
  _state = this;
  this_local = (CFGsContainer *)__return_storage_ptr__;
  Lexeme::Lexeme(__return_storage_ptr__);
  local_20 = 1;
  while (local_20 != 9) {
    local_24 = nextChar(&this->m_input);
    cVar1 = (char)this;
    switch(local_20) {
    case 1:
      if ((((local_24 == 0x20) || (local_24 == 9)) || (local_24 == 0xd)) || (local_24 == 10)) {
        local_20 = 1;
      }
      else if (local_24 == 0x30) {
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)local_24);
        __return_storage_ptr__->type = TKN_NUMBER;
        (__return_storage_ptr__->data).addr = 0;
        local_20 = 2;
      }
      else if ((local_24 < 0x31) || (0x39 < local_24)) {
        iVar3 = isalpha(local_24);
        if (iVar3 == 0) {
          if (local_24 == 0x5b) {
            std::__cxx11::string::operator+=
                      ((string *)&__return_storage_ptr__->token,(char)local_24);
            __return_storage_ptr__->type = TKN_BRACKET_OPEN;
            local_20 = 9;
          }
          else if (local_24 == 0x5d) {
            std::__cxx11::string::operator+=
                      ((string *)&__return_storage_ptr__->token,(char)local_24);
            __return_storage_ptr__->type = TKN_BRACKET_CLOSE;
            local_20 = 9;
          }
          else if (local_24 == 0x3a) {
            std::__cxx11::string::operator+=
                      ((string *)&__return_storage_ptr__->token,(char)local_24);
            __return_storage_ptr__->type = TKN_COLON;
            local_20 = 9;
          }
          else if (local_24 == 0x22) {
            __return_storage_ptr__->type = TKN_TEXT;
            local_20 = 6;
          }
          else if (local_24 == 0x2d) {
            std::__cxx11::string::operator+=
                      ((string *)&__return_storage_ptr__->token,(char)local_24);
            local_20 = 7;
          }
          else if (local_24 == 0x23) {
            local_20 = 8;
          }
          else {
            if (local_24 == -1) {
              __return_storage_ptr__->type = TKN_EOF;
            }
            else {
              __return_storage_ptr__->type = TKN_INVALID_TOKEN;
            }
            local_20 = 9;
          }
        }
        else {
          iVar3 = tolower(local_24);
          std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)iVar3);
          local_20 = 5;
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)local_24);
        __return_storage_ptr__->type = TKN_NUMBER;
        local_20 = 4;
      }
      break;
    case 2:
      iVar3 = tolower(local_24);
      if (iVar3 == 0x78) {
        iVar3 = tolower(local_24);
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)iVar3);
        __return_storage_ptr__->type = TKN_ADDR;
        local_20 = 3;
      }
      else {
        if (local_24 != -1) {
          std::istream::putback(cVar1 + '\b');
        }
        local_20 = 9;
      }
      break;
    case 3:
      iVar3 = isdigit(local_24);
      if ((iVar3 == 0) &&
         ((iVar3 = tolower(local_24), iVar3 < 0x61 || (iVar3 = tolower(local_24), 0x66 < iVar3)))) {
        std::__cxx11::string::substr((ulong)local_58,(ulong)&__return_storage_ptr__->token);
        uVar4 = std::__cxx11::stoul(local_58,(size_t *)0x0,0x10);
        (__return_storage_ptr__->data).addr = uVar4;
        std::__cxx11::string::~string((string *)local_58);
        if (local_24 != -1) {
          std::istream::putback(cVar1 + '\b');
        }
        local_20 = 9;
      }
      else {
        iVar3 = tolower(local_24);
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)iVar3);
        local_20 = 3;
      }
      break;
    case 4:
      iVar3 = isdigit(local_24);
      if (iVar3 == 0) {
        uVar5 = std::__cxx11::stoull(&__return_storage_ptr__->token,(size_t *)0x0,10);
        (__return_storage_ptr__->data).number = uVar5;
        if (local_24 != -1) {
          std::istream::putback(cVar1 + '\b');
        }
        local_20 = 9;
      }
      else {
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)local_24);
        local_20 = 4;
      }
      break;
    case 5:
      iVar3 = isalpha(local_24);
      if (iVar3 == 0) {
        bVar2 = std::operator==(&__return_storage_ptr__->token,"cfg");
        if (bVar2) {
          __return_storage_ptr__->type = TKN_CFG;
        }
        else {
          bVar2 = std::operator==(&__return_storage_ptr__->token,"node");
          if (bVar2) {
            __return_storage_ptr__->type = TKN_NODE;
          }
          else {
            bVar2 = std::operator==(&__return_storage_ptr__->token,"exit");
            if (bVar2) {
              __return_storage_ptr__->type = TKN_EXIT;
            }
            else {
              bVar2 = std::operator==(&__return_storage_ptr__->token,"halt");
              if (bVar2) {
                __return_storage_ptr__->type = TKN_HALT;
              }
              else {
                bVar2 = std::operator==(&__return_storage_ptr__->token,"true");
                if (bVar2) {
                  __return_storage_ptr__->type = TKN_BOOL;
                  (__return_storage_ptr__->data).boolean = true;
                }
                else {
                  bVar2 = std::operator==(&__return_storage_ptr__->token,"false");
                  if (bVar2) {
                    __return_storage_ptr__->type = TKN_BOOL;
                    (__return_storage_ptr__->data).boolean = false;
                  }
                  else {
                    __return_storage_ptr__->type = TKN_INVALID_TOKEN;
                  }
                }
              }
            }
          }
        }
        if (local_24 != -1) {
          std::istream::putback(cVar1 + '\b');
        }
        local_20 = 9;
      }
      else {
        iVar3 = tolower(local_24);
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)iVar3);
        local_20 = 5;
      }
      break;
    case 6:
      if (local_24 == -1) {
        __return_storage_ptr__->type = TKN_UNEXPECTED_EOF;
        local_20 = 9;
      }
      else if (local_24 == 0x22) {
        local_20 = 9;
      }
      else {
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)local_24);
        local_20 = 6;
      }
      break;
    case 7:
      if (local_24 == -1) {
        __return_storage_ptr__->type = TKN_UNEXPECTED_EOF;
      }
      else if (local_24 == 0x3e) {
        __return_storage_ptr__->type = TKN_ARROW;
        std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->token,(char)local_24);
      }
      else {
        __return_storage_ptr__->type = TKN_INVALID_TOKEN;
      }
      local_20 = 9;
      break;
    case 8:
      if (local_24 == -1) {
        local_20 = 9;
      }
      else if (local_24 == 10) {
        local_20 = 1;
      }
      else {
        local_20 = 8;
      }
      break;
    default:
      __return_storage_ptr__->type = TKN_INVALID_TOKEN;
      local_20 = 9;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CFGsContainer::Lexeme CFGsContainer::nextToken() {
	Lexeme lex;

    int state = 1;
    while (state != 9) {
        int c = nextChar(m_input);
        switch (state) {
            case 1:
            		if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
					state = 1;
				} else if (c == '0') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_NUMBER;
					lex.data.number = 0;
					state = 2;
				} else if (c >= '1' && c <= '9') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_NUMBER;
					state = 4;
				} else if (std::isalpha(c)) {
					lex.token += (char) std::tolower(c);
					state = 5;
				} else if (c == '[') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_BRACKET_OPEN;
					state = 9;
				} else if (c == ']') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_BRACKET_CLOSE;
					state = 9;
				} else if (c == ':') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_COLON;
					state = 9;
				} else if (c == '\"') {
					lex.type = Lexeme::TKN_TEXT;
					state = 6;
				} else if (c == '-') {
					lex.token += (char) c;
					state = 7;
				} else if (c == '#') {
					state = 8;
				} else if (c == -1) {
					lex.type = Lexeme::TKN_EOF;
					state = 9;
				} else {
					lex.type = Lexeme::TKN_INVALID_TOKEN;
					state = 9;
				}

				break;
            case 2:
				if (std::tolower(c) == 'x') {
					lex.token += (char) std::tolower(c);
					lex.type = Lexeme::TKN_ADDR;
					state = 3;
				} else {
					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 3:
				if (std::isdigit(c) ||
					(std::tolower(c) >= 'a' && std::tolower(c) <= 'f')) {
					lex.token += (char) std::tolower(c);
					state = 3;
				} else {
					lex.data.addr = std::stoul(lex.token.substr(2), 0, 16);

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 4:
				if (std::isdigit(c)) {
					lex.token += (char) c;
					state = 4;
				} else {
					lex.data.number = std::stoull(lex.token);

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 5:
				if (std::isalpha(c)) {
					lex.token += (char) std::tolower(c);
					state = 5;
				} else {
					if (lex.token == "cfg") {
						lex.type = Lexeme::TKN_CFG;
					} else if (lex.token == "node") {
						lex.type = Lexeme::TKN_NODE;
					} else if (lex.token == "exit") {
						lex.type = Lexeme::TKN_EXIT;
					} else if (lex.token == "halt") {
						lex.type = Lexeme::TKN_HALT;
					} else if (lex.token == "true") {
						lex.type = Lexeme::TKN_BOOL;
						lex.data.boolean = true;
					} else if (lex.token == "false") {
						lex.type = Lexeme::TKN_BOOL;
						lex.data.boolean = false;
					} else {
						lex.type = Lexeme::TKN_INVALID_TOKEN;
					}

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

				break;
			case 6:
				if (c == -1) {
					lex.type = Lexeme::TKN_UNEXPECTED_EOF;
					state = 9;
				} else {
					if (c == '\"')
						state = 9;
					else {
						lex.token += (char) c;
						state = 6;
					}
				}

				break;
			case 7:
				if (c == -1) {
					lex.type = Lexeme::TKN_UNEXPECTED_EOF;
					state = 9;
				} else {
					if (c == '>') {
						lex.type = Lexeme::TKN_ARROW;
						lex.token += (char) c;
						state = 9;
					} else {
						lex.type = Lexeme::TKN_INVALID_TOKEN;
						state = 9;
					}
				}

				break;
			case 8:
				if (c == -1) {
					state = 9;
				} else {
					if (c == '\n')
						state = 1;
					else
						state = 8;
				}

				break;
			default:
				lex.type = Lexeme::TKN_INVALID_TOKEN;
				state = 9;
				break;
		}
	}

	return lex;
}